

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*>
eastl::
equal_range<eastl::pair<char,int>*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
          (pair<char,_int> *first,pair<char,_int> *last,char *value)

{
  ulong uVar1;
  pair<char,_int> *ppVar2;
  ulong uVar3;
  pair<char,_int> *ppVar4;
  pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*> pVar5;
  
  uVar1 = (long)last - (long)first >> 3;
  do {
    while( true ) {
      ppVar4 = last;
      ppVar2 = first;
      if ((long)uVar1 < 1) goto LAB_00106a92;
      uVar3 = uVar1 >> 1;
      last = first + uVar3;
      if (*value <= last->first) break;
      first = last + 1;
      uVar1 = uVar1 + ~uVar3;
      last = ppVar4;
    }
    uVar1 = uVar3;
  } while (*value < last->first);
  ppVar2 = lower_bound<eastl::pair<char,int>*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
                     (first,last,value);
  first = upper_bound<eastl::pair<char,int>*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
                    (last + 1,ppVar4,value);
LAB_00106a92:
  pVar5.second = first;
  pVar5.first = ppVar2;
  return pVar5;
}

Assistant:

pair<ForwardIterator, ForwardIterator>
    equal_range(ForwardIterator first, ForwardIterator last, const T& value, Compare compare)
    {
        typedef pair<ForwardIterator, ForwardIterator> ResultType;
        typedef typename eastl::iterator_traits<ForwardIterator>::difference_type DifferenceType;

        DifferenceType d = eastl::distance(first, last);

        while(d > 0)
        {
            ForwardIterator i(first);
            DifferenceType  d2 = d >> 1; // We use '>>1' here instead of '/2' because MSVC++ for some reason generates significantly worse code for '/2'. Go figure.

            eastl::advance(i, d2);

            if(compare(*i, value))
            {
                EASTL_VALIDATE_COMPARE(!compare(value, *i)); // Validate that the compare function is sane.
                first = ++i;
                d    -= d2 + 1;
            }
            else if(compare(value, *i))
            {
                EASTL_VALIDATE_COMPARE(!compare(*i, value)); // Validate that the compare function is sane.
                d    = d2;
                last = i;
            }
            else
            {
                ForwardIterator j(i);

                return ResultType(eastl::lower_bound(first, i, value, compare), 
                                  eastl::upper_bound(++j, last, value, compare));
            }
        }
        return ResultType(first, first);
    }